

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIP.cpp
# Opt level: O2

void __thiscall Car::Car(Car *this,shared_ptr<Engine> *engine,shared_ptr<ILogger> *logg)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  allocator<char> local_39;
  string local_38 [32];
  
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  peVar1 = (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"car is created",&local_39);
  (*peVar1->_vptr_ILogger[2])(peVar1,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit Car(std::shared_ptr<Engine> engine, std::shared_ptr<ILogger> logg)
		:	engine(std::move(engine)),
			logger(std::move(logg))
	{
		logger->log("car is created");
	}